

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O0

void read_stop_time(stop_time_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  stop_type_t sVar2;
  timepoint_precision_t tVar3;
  ulong uVar4;
  double dVar5;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  stop_time_t *record_local;
  
  init_stop_time(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"trip_id");
    if (iVar1 == 0) {
      strcpy(record->trip_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"arrival_time");
      if (iVar1 == 0) {
        strcpy(record->arrival_time,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"departure_time");
        if (iVar1 == 0) {
          strcpy(record->departure_time,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"stop_id");
          if (iVar1 == 0) {
            strcpy(record->stop_id,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"stop_sequence");
            if (iVar1 == 0) {
              uVar4 = strtoul(field_values[local_2c],(char **)0x0,0);
              record->stop_sequence = (uint)uVar4;
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"stop_headsign");
              if (iVar1 == 0) {
                strcpy(record->stop_headsign,field_values[local_2c]);
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"pickup_type");
                if (iVar1 == 0) {
                  sVar2 = parse_stop_type(field_values[local_2c]);
                  record->pickup_type = sVar2;
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"drop_off_type");
                  if (iVar1 == 0) {
                    sVar2 = parse_stop_type(field_values[local_2c]);
                    record->dropoff_type = sVar2;
                  }
                  else {
                    iVar1 = strcmp(field_names[local_2c],"shape_dist_traveled");
                    if (iVar1 == 0) {
                      dVar5 = strtod(field_values[local_2c],(char **)0x0);
                      record->shape_dist_traveled = dVar5;
                    }
                    else {
                      iVar1 = strcmp(field_names[local_2c],"timepoint");
                      if (iVar1 == 0) {
                        tVar3 = parse_timepoint_precision(field_values[local_2c]);
                        record->timepoint = tVar3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_stop_time(stop_time_t *record, int field_count, const char **field_names, const char **field_values) {
    init_stop_time(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "arrival_time") == 0) {
            strcpy(record->arrival_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "departure_time") == 0) {
            strcpy(record->departure_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_id") == 0) {
            strcpy(record->stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_sequence") == 0) {
            record->stop_sequence = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "stop_headsign") == 0) {
            strcpy(record->stop_headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "pickup_type") == 0) {
            record->pickup_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "drop_off_type") == 0) {
            record->dropoff_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_dist_traveled") == 0) {
            record->shape_dist_traveled = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "timepoint") == 0) {
            record->timepoint = parse_timepoint_precision(field_values[i]);
            continue;
        }
    }
}